

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

bool __thiscall BCLog::Logger::StartLogging(Logger *this)

{
  list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *this_00;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *plVar1;
  string_view source_file;
  string_view logging_function;
  string_view threadname;
  int iVar2;
  FILE *__stream;
  bool bVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view logging_function_00;
  string s;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
LAB_00de692a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_system_error(iVar2);
LAB_00de6948:
      __assert_fail("m_buffering",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                    ,0x37,"bool BCLog::Logger::StartLogging()");
    }
    goto LAB_00de6a24;
  }
  if (this->m_buffering == false) goto LAB_00de6948;
  if (this->m_fileout != (FILE *)0x0) {
    __assert_fail("m_fileout == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x38,"bool BCLog::Logger::StartLogging()");
  }
  if (this->m_print_to_file == true) {
    if ((this->m_file_path).super_path._M_pathname._M_string_length == 0) {
      __assert_fail("!m_file_path.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                    ,0x3b,"bool BCLog::Logger::StartLogging()");
    }
    __stream = fsbridge::fopen((char *)&this->m_file_path,"a");
    this->m_fileout = (FILE *)__stream;
    if (__stream != (FILE *)0x0) {
      setbuf(__stream,(char *)0x0);
      fwrite("\n\n\n\n\n",1,5,(FILE *)this->m_fileout);
      goto LAB_00de66d2;
    }
    bVar3 = false;
  }
  else {
LAB_00de66d2:
    this->m_buffering = false;
    if (this->m_buffer_lines_discarded != 0) {
      tinyformat::format<unsigned_long>
                (&local_58,"Early logging buffer overflowed, %d log lines discarded.\n",
                 &this->m_buffer_lines_discarded);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
      ;
      source_file._M_len = 0x5b;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function_00._M_str = "StartLogging";
      logging_function_00._M_len = 0xc;
      LogPrintStr_(this,str,logging_function_00,source_file,0x4b,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = &this->m_msgs_before_open;
    p_Var4 = (this->m_msgs_before_open).
             super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 != (_List_node_base *)this_00) {
      plVar1 = &this->m_print_callbacks;
      do {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,p_Var4[2]._M_next,
                   (long)&(p_Var4[2]._M_prev)->_M_next + (long)p_Var4[2]._M_next);
        logging_function._M_str = (char *)p_Var4[4]._M_next;
        logging_function._M_len = (size_t)p_Var4[4]._M_prev;
        threadname._M_str = (char *)p_Var4[8]._M_next;
        threadname._M_len = (size_t)p_Var4[8]._M_prev;
        source_file_00._M_str = (char *)p_Var4[6]._M_next;
        source_file_00._M_len = (size_t)p_Var4[6]._M_prev;
        FormatLogStrInPlace(this,&local_58,(LogFlags)p_Var4[10]._M_prev,
                            *(Level *)&p_Var4[0xb]._M_next,source_file_00,
                            *(int *)&p_Var4[10]._M_next,logging_function,threadname,
                            (time_point)p_Var4[1]._M_next,(seconds)p_Var4[1]._M_prev);
        std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
        ::_M_erase(this_00,(this->m_msgs_before_open).
                           super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                           ._M_impl._M_node.super__List_node_base._M_next);
        if (this->m_print_to_file == true) {
          fwrite(local_58._M_dataplus._M_p,1,local_58._M_string_length,(FILE *)this->m_fileout);
        }
        p_Var4 = (_List_node_base *)plVar1;
        if (this->m_print_to_console == true) {
          fwrite(local_58._M_dataplus._M_p,1,local_58._M_string_length,_stdout);
        }
        while (p_Var4 = (((_List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                           *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)plVar1) {
          if (p_Var4[2]._M_next == (_List_node_base *)0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00de6a24;
            iVar2 = std::__throw_bad_function_call();
            goto LAB_00de692a;
          }
          (*(code *)p_Var4[2]._M_prev)(p_Var4 + 1,&local_58);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        p_Var4 = (this_00->
                 super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
      } while (p_Var4 != (_List_node_base *)this_00);
    }
    this->m_cur_buffer_memusage = 0;
    bVar3 = true;
    if (this->m_print_to_console == true) {
      fflush(_stdout);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
LAB_00de6a24:
  __stack_chk_fail();
}

Assistant:

bool BCLog::Logger::StartLogging()
{
    StdLockGuard scoped_lock(m_cs);

    assert(m_buffering);
    assert(m_fileout == nullptr);

    if (m_print_to_file) {
        assert(!m_file_path.empty());
        m_fileout = fsbridge::fopen(m_file_path, "a");
        if (!m_fileout) {
            return false;
        }

        setbuf(m_fileout, nullptr); // unbuffered

        // Add newlines to the logfile to distinguish this execution from the
        // last one.
        FileWriteStr("\n\n\n\n\n", m_fileout);
    }

    // dump buffered messages from before we opened the log
    m_buffering = false;
    if (m_buffer_lines_discarded > 0) {
        LogPrintStr_(strprintf("Early logging buffer overflowed, %d log lines discarded.\n", m_buffer_lines_discarded), __func__, __FILE__, __LINE__, BCLog::ALL, Level::Info);
    }
    while (!m_msgs_before_open.empty()) {
        const auto& buflog = m_msgs_before_open.front();
        std::string s{buflog.str};
        FormatLogStrInPlace(s, buflog.category, buflog.level, buflog.source_file, buflog.source_line, buflog.logging_function, buflog.threadname, buflog.now, buflog.mocktime);
        m_msgs_before_open.pop_front();

        if (m_print_to_file) FileWriteStr(s, m_fileout);
        if (m_print_to_console) fwrite(s.data(), 1, s.size(), stdout);
        for (const auto& cb : m_print_callbacks) {
            cb(s);
        }
    }
    m_cur_buffer_memusage = 0;
    if (m_print_to_console) fflush(stdout);

    return true;
}